

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprTruthValue(Expr *pExpr)

{
  ExprList_item *pEVar1;
  
  while ((pExpr->flags & 0x82000) != 0) {
    if ((pExpr->flags >> 0x13 & 1) == 0) {
      if (pExpr->op != 'r') break;
      pEVar1 = (ExprList_item *)&pExpr->pLeft;
    }
    else {
      pEVar1 = ((pExpr->x).pList)->a;
    }
    pExpr = pEVar1->pExpr;
  }
  return (uint)((pExpr->u).zToken[4] == '\0');
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprSkipCollateAndLikely(Expr *pExpr){
  while( pExpr && ExprHasProperty(pExpr, EP_Skip|EP_Unlikely) ){
    if( ExprHasProperty(pExpr, EP_Unlikely) ){
      assert( ExprUseXList(pExpr) );
      assert( pExpr->x.pList->nExpr>0 );
      assert( pExpr->op==TK_FUNCTION );
      pExpr = pExpr->x.pList->a[0].pExpr;
    }else if( pExpr->op==TK_COLLATE ){
      pExpr = pExpr->pLeft;
    }else{
      break;
    }
  }
  return pExpr;
}